

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O1

int getPipeValue(int param,Link *link,double *value,Network *nw)

{
  pointer pcVar1;
  int iVar2;
  Node *pNVar3;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  double local_30;
  
  local_30 = (nw->units).factors[1];
  *value = 0.0;
  iVar2 = (*(link->super_Element)._vptr_Element[2])(link);
  if (iVar2 != 0) {
    return 0;
  }
  iVar2 = 0xcb;
  switch(param) {
  case 1:
    pNVar3 = (Node *)(local_30 * (double)link[1].super_Element.name._M_dataplus._M_p);
    break;
  case 2:
    *value = (double)link[1].super_Element.name._M_string_length;
    pcVar1 = (nw->options).stringOptions[4]._M_dataplus._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + (nw->options).stringOptions[4]._M_string_length);
    iVar2 = std::__cxx11::string::compare((char *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if (iVar2 != 0) {
      return 0;
    }
    pNVar3 = (Node *)(local_30 * 1000.0 * *value);
    break;
  case 3:
  case 4:
  case 5:
    goto switchD_001219ea_caseD_3;
  case 6:
    pNVar3 = link[1].toNode;
    break;
  case 7:
    pNVar3 = *(Node **)&link[1].initStatus;
    break;
  default:
    if (param == 0xf) {
      pNVar3 = *(Node **)&link[1].super_Element.index;
      break;
    }
    if (param != 0x10) {
      return 0xcb;
    }
    pNVar3 = link[1].fromNode;
    goto LAB_00121ab4;
  }
  iVar2 = 0;
LAB_00121ab4:
  *value = (double)pNVar3;
switchD_001219ea_caseD_3:
  return iVar2;
}

Assistant:

int getPipeValue(int param, Link* link, double* value, Network* nw)
{
    double lcf = nw->ucf(Units::LENGTH);
    *value = 0.0;
    if ( link->type() != Link::PIPE ) return 0;
    Pipe* pipe = static_cast<Pipe*>(link);
    switch (param)
    {
    case EN_LENGTH:
        *value = pipe->length * lcf;
        break;
    case EN_ROUGHNESS:
        *value = pipe->roughness;
        if ( nw->option(Options::HEADLOSS_MODEL) == "D-W") *value *= 1000.0 * lcf;
        break;
    case EN_KBULK:
        *value = pipe->bulkCoeff;
        break;
    case EN_KWALL:
        *value = pipe->wallCoeff;
        break;
    case EN_LEAKCOEFF1:
        *value = pipe->leakCoeff1;
        break;
    case EN_LEAKCOEFF2:
        *value = pipe->leakCoeff2;
    default: return 203;
    }
    return 0;
}